

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int initialize(argon2_instance_t *instance,argon2_context *context)

{
  uint8_t local_68 [4];
  int result;
  uint8_t blockhash [72];
  argon2_context *context_local;
  argon2_instance_t *instance_local;
  
  if ((instance == (argon2_instance_t *)0x0) || (context == (argon2_context *)0x0)) {
    instance_local._4_4_ = -0x19;
  }
  else {
    instance->context_ptr = context;
    blockhash._64_8_ = context;
    instance_local._4_4_ = allocate_memory(context,instance);
    if (instance_local._4_4_ == 0) {
      initial_hash(local_68,(argon2_context *)blockhash._64_8_,instance->type);
      clear_internal_memory(blockhash + 0x38,8);
      if (instance->print_internals != 0) {
        initial_kat(local_68,(argon2_context *)blockhash._64_8_,instance->type);
      }
      fill_first_blocks(local_68,instance);
      clear_internal_memory(local_68,0x48);
      instance_local._4_4_ = 0;
    }
  }
  return instance_local._4_4_;
}

Assistant:

int initialize(argon2_instance_t *instance, argon2_context *context) {
    uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH];
    int result = ARGON2_OK;

    if (instance == NULL || context == NULL)
        return ARGON2_INCORRECT_PARAMETER;
    instance->context_ptr = context;

    /* 1. Memory allocation */

    result = allocate_memory(context, instance);
    if (result != ARGON2_OK) {
        return result;
    }

    /* 2. Initial hashing */
    /* H_0 + 8 extra bytes to produce the first blocks */
    /* uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH]; */
    /* Hashing all inputs */
    initial_hash(blockhash, context, instance->type);
    /* Zeroing 8 extra bytes */
    clear_internal_memory(blockhash + ARGON2_PREHASH_DIGEST_LENGTH,
                          ARGON2_PREHASH_SEED_LENGTH -
                              ARGON2_PREHASH_DIGEST_LENGTH);

    if (instance->print_internals) {
        initial_kat(blockhash, context, instance->type);
    }

    /* 3. Creating first blocks, we always have at least two blocks in a slice
     */
    fill_first_blocks(blockhash, instance);
    /* Clearing the hash */
    clear_internal_memory(blockhash, ARGON2_PREHASH_SEED_LENGTH);

    return ARGON2_OK;
}